

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_rwkv_session::tokenize
          (llm_tokenizer_rwkv_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  char cVar1;
  undefined1 uVar2;
  pointer pcVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  undefined8 in_RAX;
  ulong uVar6;
  _Base_ptr p_Var7;
  int iVar8;
  _Rb_tree_header *p_Var9;
  uint uVar10;
  _Base_ptr p_Var11;
  undefined8 local_38;
  
  if (text->_M_string_length != 0) {
    uVar6 = 0;
    uVar10 = 0;
    local_38 = in_RAX;
    do {
      p_Var11 = (this->tokenizer->token_matcher).children._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_parent;
      if (p_Var11 == (_Base_ptr)0x0) {
LAB_00219ea5:
        iVar8 = *(int *)((long)(this->vocab->pimpl)._M_t.
                               super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                               .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
        local_38 = CONCAT44(iVar8,(int)local_38);
        iVar4._M_current =
             (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar4._M_current ==
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          llama_vocab::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (output,iVar4,(int *)((long)&local_38 + 4));
        }
        else {
          *iVar4._M_current = iVar8;
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
        uVar10 = uVar10 + 1;
        uVar6 = (ulong)uVar10;
      }
      else {
        pcVar3 = (text->_M_dataplus)._M_p;
        cVar1 = pcVar3[uVar6];
        p_Var9 = &(this->tokenizer->token_matcher).children._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var9->_M_header;
        do {
          uVar2 = (undefined1)p_Var11[1]._M_color;
          if (cVar1 <= (char)uVar2) {
            p_Var7 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[(char)uVar2 < cVar1];
        } while (p_Var11 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var9) || (cVar1 < (char)p_Var7[1]._M_color))
        goto LAB_00219ea5;
        uVar6 = 0;
        iVar8 = 0;
        while( true ) {
          if (*(char *)&p_Var7[2]._M_right != '\0') {
            iVar8 = *(int *)((long)&p_Var7[2]._M_right + 4);
            uVar6 = (ulong)(uVar10 + 1);
          }
          uVar10 = uVar10 + 1;
          p_Var11 = p_Var7[1]._M_right;
          if (p_Var11 == (_Base_ptr)0x0) break;
          cVar1 = pcVar3[uVar10];
          p_Var5 = p_Var7 + 1;
          p_Var7 = (_Base_ptr)&p_Var5->_M_left;
          do {
            uVar2 = (undefined1)p_Var11[1]._M_color;
            if (cVar1 <= (char)uVar2) {
              p_Var7 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[(char)uVar2 < cVar1];
          } while (p_Var11 != (_Base_ptr)0x0);
          if ((p_Var7 == (_Base_ptr)&p_Var5->_M_left) || (cVar1 < (char)p_Var7[1]._M_color)) break;
        }
        local_38 = CONCAT44(local_38._4_4_,iVar8);
        iVar4._M_current =
             (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar4._M_current ==
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          llama_vocab::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (output,iVar4,(int *)&local_38);
        }
        else {
          *iVar4._M_current = iVar8;
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
        uVar10 = (uint)uVar6;
      }
    } while (uVar6 < text->_M_string_length);
  }
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        uint32_t position = 0;
        while (position < text.size()) {
            const struct naive_trie * node = tokenizer.token_matcher.traverse(text[position]);
            if (node == NULL) {
                // no matching token found, add unknown token
                output.push_back(vocab.token_unk());
                position += 1;
                continue;
            }

            // traverse the trie to find the longest matching token
            uint32_t token_id = 0;
            uint32_t token_length = 0;
            while (node != NULL) {
                if (node->has_value) {
                    token_id = node->value;
                    token_length = position + 1;
                }
                node = node->traverse(text[++position]);
            }

            // add the longest matching token
            output.push_back(token_id);
            position = token_length;
        }
    }